

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonExtractFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  uint uVar2;
  sqlite3_value *psVar3;
  Mem *pMVar4;
  char *pcVar5;
  void *pvVar6;
  u32 uVar7;
  uint uVar8;
  JsonParse *pParse;
  char *__s;
  size_t sVar9;
  ulong uVar10;
  int iVar11;
  uint N;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  JsonString jx;
  JsonString local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_c0,0xaa,0x88);
  if ((1 < argc) && (pParse = jsonParseFuncArg(ctx,*argv,0), pParse != (JsonParse *)0x0)) {
    pvVar6 = ctx->pFunc->pUserData;
    local_c0.zBuf = local_c0.zSpace;
    local_c0.nAlloc = 100;
    local_c0.bStatic = '\x01';
    local_c0.eErr = '\0';
    if (argc != 2) {
      local_c0.zSpace[0] = '[';
    }
    local_c0.nUsed = (u64)(argc != 2);
    uVar12 = 2;
    if (2 < argc) {
      uVar12 = (ulong)(uint)argc;
    }
    uVar13 = 1;
    local_c0.pCtx = ctx;
    do {
      __s = (char *)sqlite3ValueText(argv[uVar13],'\x01');
      iVar11 = 5;
      if (__s != (char *)0x0) {
        sVar9 = strlen(__s);
        if (*__s == '$') {
          uVar7 = jsonLookupStep(pParse,0,__s + 1,0);
        }
        else {
          if (((ulong)pvVar6 & 3) == 0) {
            jsonBadPathError(ctx,__s);
            goto LAB_001b91ea;
          }
          uVar8 = (uint)sVar9;
          N = uVar8 & 0x3fffffff;
          local_c0.zBuf = local_c0.zSpace;
          local_c0.nAlloc = 100;
          local_c0.nUsed = 0;
          local_c0.bStatic = '\x01';
          local_c0.eErr = '\0';
          psVar3 = argv[uVar13];
          uVar2._0_2_ = psVar3->flags;
          uVar2._2_1_ = psVar3->enc;
          uVar2._3_1_ = psVar3->eSubtype;
          if ((0x50505050UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
            if ((sVar9 & 0x3fffffff) == 0) {
              uVar10 = 0;
            }
            else {
              uVar10 = 0;
              do {
                if (((ulong)(byte)__s[uVar10] != 0x5f) && ((""[(byte)__s[uVar10]] & 6) == 0))
                goto LAB_001b8fcd;
                uVar10 = uVar10 + 1;
              } while ((uVar8 & 0x3fffffff) != uVar10);
              uVar10 = (ulong)N;
            }
LAB_001b8fcd:
            if ((uint)uVar10 == N) {
              local_c0.pCtx = ctx;
              jsonAppendRawNZ(&local_c0,".",1);
            }
            else if ((N < 3 || *__s != '[') ||
                    (local_c0.pCtx = ctx, __s[(ulong)(uVar8 & 0x3fffffff) - 1] != ']')) {
              local_c0.pCtx = ctx;
              jsonAppendRawNZ(&local_c0,".\"",2);
              jsonAppendRaw(&local_c0,__s,N);
              pcVar5 = ".\"";
              uVar7 = 1;
              goto LAB_001b9064;
            }
            jsonAppendRaw(&local_c0,__s,N);
          }
          else {
            local_c0.pCtx = ctx;
            jsonAppendRawNZ(&local_c0,"[",1);
            if (*__s == '-') {
              jsonAppendRawNZ(&local_c0,"#",1);
            }
            jsonAppendRaw(&local_c0,__s,N);
            pcVar5 = "[]";
            uVar7 = 2;
LAB_001b9064:
            jsonAppendRawNZ(&local_c0,pcVar5 + 1,uVar7);
          }
          jsonStringTerminate(&local_c0);
          uVar7 = jsonLookupStep(pParse,0,local_c0.zBuf,0);
          if (local_c0.bStatic == '\0') {
            if (*(ulong *)(local_c0.zBuf + -8) < 2) {
              sqlite3_free(local_c0.zBuf + -8);
            }
            else {
              *(ulong *)(local_c0.zBuf + -8) = *(ulong *)(local_c0.zBuf + -8) - 1;
            }
          }
          local_c0.zBuf = local_c0.zSpace;
          local_c0.nAlloc = 100;
          local_c0.nUsed = 0;
          local_c0.bStatic = '\x01';
        }
        if (uVar7 < pParse->nBlob) {
          if (argc == 2) {
            if (((ulong)pvVar6 & 1) == 0) {
              jsonReturnFromBlob(pParse,uVar7,ctx,0);
              iVar11 = 0;
              if ((((ulong)pvVar6 & 10) == 0) && (10 < (pParse->aBlob[uVar7] & 0xf))) {
                pMVar4 = ctx->pOut;
                pMVar4->eSubtype = 'J';
                pbVar1 = (byte *)((long)&pMVar4->flags + 1);
                *pbVar1 = *pbVar1 | 8;
                iVar11 = 0;
              }
            }
            else {
              local_c0.nAlloc = 100;
              local_c0.nUsed = 0;
              local_c0.bStatic = '\x01';
              local_c0.eErr = '\0';
              local_c0.pCtx = ctx;
              local_c0.zBuf = local_c0.zSpace;
              jsonTranslateBlobToText(pParse,uVar7,&local_c0);
              jsonReturnString(&local_c0,(JsonParse *)0x0,(sqlite3_context *)0x0);
              if (local_c0.bStatic == '\0') {
                if (*(ulong *)(local_c0.zBuf + -8) < 2) {
                  sqlite3_free(local_c0.zBuf + -8);
                }
                else {
                  *(ulong *)(local_c0.zBuf + -8) = *(ulong *)(local_c0.zBuf + -8) - 1;
                }
              }
              local_c0.nAlloc = 100;
              local_c0.nUsed = 0;
              local_c0.bStatic = '\x01';
              pMVar4 = ctx->pOut;
              pMVar4->eSubtype = 'J';
              pbVar1 = (byte *)((long)&pMVar4->flags + 1);
              *pbVar1 = *pbVar1 | 8;
              iVar11 = 0;
              local_c0.zBuf = local_c0.zSpace;
            }
          }
          else {
            jsonAppendSeparator(&local_c0);
            jsonTranslateBlobToText(pParse,uVar7,&local_c0);
            iVar11 = 0;
          }
        }
        else if (uVar7 == 0xffffffff) {
          ctx->isError = 1;
          sqlite3VdbeMemSetStr
                    (ctx->pOut,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
          ;
          iVar11 = 5;
        }
        else if (uVar7 == 0xfffffffe) {
          if (argc != 2) {
            jsonAppendSeparator(&local_c0);
            jsonAppendRawNZ(&local_c0,"null",4);
            iVar11 = 0;
          }
        }
        else {
          jsonBadPathError(ctx,__s);
          iVar11 = 5;
        }
      }
LAB_001b91ea:
      if (iVar11 != 0) {
        if (iVar11 != 5) goto LAB_001b9367;
        goto LAB_001b9317;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar12);
    if (argc != 2) {
      if (local_c0.nUsed < local_c0.nAlloc) {
        local_c0.zBuf[local_c0.nUsed] = ']';
        local_c0.nUsed = local_c0.nUsed + 1;
      }
      else {
        jsonAppendCharExpand(&local_c0,']');
      }
      jsonReturnString(&local_c0,(JsonParse *)0x0,(sqlite3_context *)0x0);
      if (((ulong)pvVar6 & 8) == 0) {
        pMVar4 = ctx->pOut;
        pMVar4->eSubtype = 'J';
        pbVar1 = (byte *)((long)&pMVar4->flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
    }
LAB_001b9317:
    if (local_c0.bStatic == '\0') {
      if (*(ulong *)(local_c0.zBuf + -8) < 2) {
        sqlite3_free(local_c0.zBuf + -8);
      }
      else {
        *(ulong *)(local_c0.zBuf + -8) = *(ulong *)(local_c0.zBuf + -8) - 1;
      }
    }
    local_c0.nAlloc = 100;
    local_c0.nUsed = 0;
    local_c0.bStatic = '\x01';
    local_c0.zBuf = local_c0.zSpace;
    jsonParseFree(pParse);
  }
LAB_001b9367:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void jsonExtractFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p = 0;      /* The parse */
  int flags;             /* Flags associated with the function */
  int i;                 /* Loop counter */
  JsonString jx;         /* String for array result */

  if( argc<2 ) return;
  p = jsonParseFuncArg(ctx, argv[0], 0);
  if( p==0 ) return;
  flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  jsonStringInit(&jx, ctx);
  if( argc>2 ){
    jsonAppendChar(&jx, '[');
  }
  for(i=1; i<argc; i++){
    /* With a single PATH argument */
    const char *zPath = (const char*)sqlite3_value_text(argv[i]);
    int nPath;
    u32 j;
    if( zPath==0 ) goto json_extract_error;
    nPath = sqlite3Strlen30(zPath);
    if( zPath[0]=='$' ){
      j = jsonLookupStep(p, 0, zPath+1, 0);
    }else if( (flags & JSON_ABPATH) ){
      /* The -> and ->> operators accept abbreviated PATH arguments.  This
      ** is mostly for compatibility with PostgreSQL, but also for
      ** convenience.
      **
      **     NUMBER   ==>  $[NUMBER]     // PG compatible
      **     LABEL    ==>  $.LABEL       // PG compatible
      **     [NUMBER] ==>  $[NUMBER]     // Not PG.  Purely for convenience
      **
      ** Updated 2024-05-27:  If the NUMBER is negative, then PG counts from
      ** the right of the array.  Hence for negative NUMBER:
      **
      **     NUMBER   ==>  $[#NUMBER]    // PG compatible
      */
      jsonStringInit(&jx, ctx);
      if( sqlite3_value_type(argv[i])==SQLITE_INTEGER ){
        jsonAppendRawNZ(&jx, "[", 1);
        if( zPath[0]=='-' ) jsonAppendRawNZ(&jx,"#",1);
        jsonAppendRaw(&jx, zPath, nPath);
        jsonAppendRawNZ(&jx, "]", 2);
      }else if( jsonAllAlphanum(zPath, nPath) ){
        jsonAppendRawNZ(&jx, ".", 1);
        jsonAppendRaw(&jx, zPath, nPath);
      }else if( zPath[0]=='[' && nPath>=3 && zPath[nPath-1]==']' ){
        jsonAppendRaw(&jx, zPath, nPath);
      }else{
        jsonAppendRawNZ(&jx, ".\"", 2);
        jsonAppendRaw(&jx, zPath, nPath);
        jsonAppendRawNZ(&jx, "\"", 1);
      }
      jsonStringTerminate(&jx);
      j = jsonLookupStep(p, 0, jx.zBuf, 0);
      jsonStringReset(&jx);
    }else{
      jsonBadPathError(ctx, zPath);
      goto json_extract_error;
    }
    if( j<p->nBlob ){
      if( argc==2 ){
        if( flags & JSON_JSON ){
          jsonStringInit(&jx, ctx);
          jsonTranslateBlobToText(p, j, &jx);
          jsonReturnString(&jx, 0, 0);
          jsonStringReset(&jx);
          assert( (flags & JSON_BLOB)==0 );
          sqlite3_result_subtype(ctx, JSON_SUBTYPE);
        }else{
          jsonReturnFromBlob(p, j, ctx, 0);
          if( (flags & (JSON_SQL|JSON_BLOB))==0
           && (p->aBlob[j]&0x0f)>=JSONB_ARRAY
          ){
            sqlite3_result_subtype(ctx, JSON_SUBTYPE);
          }
        }
      }else{
        jsonAppendSeparator(&jx);
        jsonTranslateBlobToText(p, j, &jx);
      }
    }else if( j==JSON_LOOKUP_NOTFOUND ){
      if( argc==2 ){
        goto json_extract_error;  /* Return NULL if not found */
      }else{
        jsonAppendSeparator(&jx);
        jsonAppendRawNZ(&jx, "null", 4);
      }
    }else if( j==JSON_LOOKUP_ERROR ){
      sqlite3_result_error(ctx, "malformed JSON", -1);
      goto json_extract_error;
    }else{
      jsonBadPathError(ctx, zPath);
      goto json_extract_error;
    }
  }
  if( argc>2 ){
    jsonAppendChar(&jx, ']');
    jsonReturnString(&jx, 0, 0);
    if( (flags & JSON_BLOB)==0 ){
      sqlite3_result_subtype(ctx, JSON_SUBTYPE);
    }
  }
json_extract_error:
  jsonStringReset(&jx);
  jsonParseFree(p);
  return;
}